

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElementDecl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLElementDecl::serialize(XMLElementDecl *this,XSerializeEngine *serEng)

{
  undefined8 in_RAX;
  size_t in_RCX;
  void *in_RDX;
  int i;
  CreateReasons local_24;
  
  local_24 = (CreateReasons)((ulong)in_RAX >> 0x20);
  if (serEng->fStoreLoad != 0) {
    xercesc_4_0::operator>>(serEng,&this->fElementName);
    XSerializeEngine::operator>>(serEng,(int *)&local_24);
    this->fCreateReason = local_24;
    XSerializeEngine::readSize(serEng,&this->fId);
    XSerializeEngine::operator>>(serEng,&this->fExternalElement);
    return;
  }
  XSerializeEngine::write(serEng,(int)this->fElementName,in_RDX,in_RCX);
  XSerializeEngine::operator<<(serEng,this->fCreateReason);
  XSerializeEngine::writeSize(serEng,this->fId);
  XSerializeEngine::operator<<(serEng,this->fExternalElement);
  return;
}

Assistant:

void XMLElementDecl::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fElementName;
        serEng<<(int) fCreateReason;
        serEng.writeSize (fId);
        serEng<<fExternalElement;
    }
    else
    {
        serEng>>fElementName;

        int i;
        serEng>>i;
        fCreateReason=(CreateReasons)i;

        serEng.readSize (fId);
        serEng>>fExternalElement;
    }

}